

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void __thiscall KokkosTools::SpaceTimeStack::State::State(State *this)

{
  long lVar1;
  undefined4 *puVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  StackNode::StackNode(&this->stack_root,(StackNode *)0x0,&local_38,STACK_REGION);
  std::__cxx11::string::~string((string *)&local_38);
  this->stack_frame = &this->stack_root;
  lVar1 = -0x118;
  do {
    puVar2 = (undefined4 *)
             ((long)&this->hwm_allocations[0].alloc_set._M_t._M_impl.super__Rb_tree_header._M_header
                     ._M_color + lVar1);
    *(undefined8 *)((long)&this->hwm_allocations[0].total_size + lVar1) = 0;
    *puVar2 = 0;
    *(undefined8 *)
     ((long)&this->hwm_allocations[0].alloc_set._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent + lVar1) = 0;
    *(undefined4 **)
     ((long)&this->hwm_allocations[0].alloc_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left
     + lVar1) = puVar2;
    *(undefined4 **)
     ((long)&this->hwm_allocations[0].alloc_set._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_right + lVar1) = puVar2;
    *(undefined8 *)
     ((long)&this->hwm_allocations[0].alloc_set._M_t._M_impl.super__Rb_tree_header._M_node_count +
     lVar1) = 0;
    lVar1 = lVar1 + 0x38;
  } while (lVar1 != 0);
  lVar1 = -0x118;
  do {
    puVar2 = (undefined4 *)((long)&this[1].stack_root.name._M_string_length + lVar1);
    *(undefined8 *)((long)&this[1].stack_root.parent + lVar1) = 0;
    *puVar2 = 0;
    *(undefined8 *)((long)&this[1].stack_root.name.field_2 + lVar1) = 0;
    *(undefined4 **)((long)this[1].current_allocations + lVar1 + -0x80) = puVar2;
    *(undefined4 **)((long)this[1].current_allocations + lVar1 + -0x78) = puVar2;
    *(undefined8 *)
     (&(((set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
          *)(this[1].current_allocations + -2))->_M_t)._M_impl.field_0x0 + lVar1) = 0;
    lVar1 = lVar1 + 0x38;
  } while (lVar1 != 0);
  StackNode::begin(&this->stack_root);
  return;
}

Assistant:

State() : stack_root(nullptr, "", STACK_REGION), stack_frame(&stack_root) {
    stack_frame->begin();
  }